

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O2

bool __thiscall Gluco::Solver::simplify(Solver *this)

{
  CRef CVar1;
  
  if ((this->trail_lim).sz != 0) {
    __assert_fail("decisionLevel() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/Glucose.cpp"
                  ,0x3e9,"bool Gluco::Solver::simplify()");
  }
  if ((this->ok != true) || (CVar1 = propagate(this), CVar1 != 0xffffffff)) {
    this->ok = false;
    return false;
  }
  if ((this->trail).sz == this->simpDB_assigns) {
    return true;
  }
  if (0 < this->simpDB_props) {
    return true;
  }
  removeSatisfied(this,&this->learnts);
  if (this->remove_satisfied == true) {
    removeSatisfied(this,&this->clauses);
  }
  checkGarbage(this);
  rebuildOrderHeap(this);
  this->simpDB_assigns = (this->trail).sz;
  this->simpDB_props = this->learnts_literals + this->clauses_literals;
  return true;
}

Assistant:

bool Solver::simplify()
{
    assert(decisionLevel() == 0);

    if (!ok || propagate() != CRef_Undef)
        return ok = false;

    if (nAssigns() == simpDB_assigns || (simpDB_props > 0))
        return true;

    // Remove satisfied clauses:
    removeSatisfied(learnts);
    if (remove_satisfied)        // Can be turned off.
        removeSatisfied(clauses);

    checkGarbage();

    rebuildOrderHeap();

    simpDB_assigns = nAssigns();
    simpDB_props   = clauses_literals + learnts_literals;   // (shouldn't depend on stats really, but it will do for now)

    return true;
}